

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mame_ym2612fm.c
# Opt level: O3

void OPNWriteMode(FM_OPN *OPN,int r,int v)

{
  UINT8 UVar1;
  FM_CH *pFVar2;
  void *pvVar3;
  FM_IRQHANDLER p_Var4;
  FM_TIMERHANDLER p_Var5;
  FM_SLOT *SLOT;
  byte bVar6;
  uint uVar7;
  UINT8 UVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  byte bVar12;
  
  bVar9 = (byte)v;
  switch(r) {
  case 0x22:
    if ((v & 8U) == 0) {
      OPN->lfo_timer_overflow = 0;
      OPN->LFO_AM = 0x7e;
      OPN->lfo_timer = 0;
      OPN->lfo_cnt = '\0';
      OPN->LFO_PM = 0;
    }
    else {
      OPN->lfo_timer_overflow = lfo_samples_per_step[v & 7] << 0x18;
    }
    break;
  case 0x24:
    (OPN->ST).TA = ((OPN->ST).TA & 3U) + v * 4;
    break;
  case 0x25:
    (OPN->ST).TA = v & 3U | (OPN->ST).TA & 0x3fcU;
    break;
  case 0x26:
    (OPN->ST).TB = bVar9;
    break;
  case 0x27:
    pvVar3 = (OPN->ST).param;
    if ((((OPN->ST).mode ^ v) & 0xc0) != 0) {
      pFVar2 = OPN->P_CH;
      pFVar2[2].SLOT[0].Incr = -1;
      if (((v & 0xc0U) != 0x80) && ((OPN->SL3).key_csm != '\0')) {
        if ((pFVar2[2].SLOT[0].key == '\0') && (1 < pFVar2[2].SLOT[0].state)) {
          pFVar2[2].SLOT[0].state = '\x01';
          bVar9 = pFVar2[2].SLOT[0].ssg;
          if ((bVar9 & 8) != 0) {
            iVar11 = pFVar2[2].SLOT[0].volume;
            if ((bVar9 & 4) != pFVar2[2].SLOT[0].ssgn) {
              iVar11 = 0x200 - iVar11;
              pFVar2[2].SLOT[0].volume = iVar11;
            }
            if (0x1ff < iVar11) {
              pFVar2[2].SLOT[0].volume = 0x3ff;
              pFVar2[2].SLOT[0].state = '\0';
              iVar11 = 0x3ff;
            }
            pFVar2[2].SLOT[0].vol_out = iVar11 + pFVar2[2].SLOT[0].tl;
          }
        }
        if ((pFVar2[2].SLOT[2].key == '\0') && (1 < pFVar2[2].SLOT[2].state)) {
          pFVar2[2].SLOT[2].state = '\x01';
          bVar9 = pFVar2[2].SLOT[2].ssg;
          if ((bVar9 & 8) != 0) {
            iVar11 = pFVar2[2].SLOT[2].volume;
            if ((bVar9 & 4) != pFVar2[2].SLOT[2].ssgn) {
              iVar11 = 0x200 - iVar11;
              pFVar2[2].SLOT[2].volume = iVar11;
            }
            if (0x1ff < iVar11) {
              pFVar2[2].SLOT[2].volume = 0x3ff;
              pFVar2[2].SLOT[2].state = '\0';
              iVar11 = 0x3ff;
            }
            pFVar2[2].SLOT[2].vol_out = iVar11 + pFVar2[2].SLOT[2].tl;
          }
        }
        if ((pFVar2[2].SLOT[1].key == '\0') && (1 < pFVar2[2].SLOT[1].state)) {
          pFVar2[2].SLOT[1].state = '\x01';
          bVar9 = pFVar2[2].SLOT[1].ssg;
          if ((bVar9 & 8) != 0) {
            iVar11 = pFVar2[2].SLOT[1].volume;
            if ((bVar9 & 4) != pFVar2[2].SLOT[1].ssgn) {
              iVar11 = 0x200 - iVar11;
              pFVar2[2].SLOT[1].volume = iVar11;
            }
            if (0x1ff < iVar11) {
              pFVar2[2].SLOT[1].volume = 0x3ff;
              pFVar2[2].SLOT[1].state = '\0';
              iVar11 = 0x3ff;
            }
            pFVar2[2].SLOT[1].vol_out = iVar11 + pFVar2[2].SLOT[1].tl;
          }
        }
        if ((pFVar2[2].SLOT[3].key == '\0') && (1 < pFVar2[2].SLOT[3].state)) {
          pFVar2[2].SLOT[3].state = '\x01';
          bVar9 = pFVar2[2].SLOT[3].ssg;
          if ((bVar9 & 8) != 0) {
            iVar11 = pFVar2[2].SLOT[3].volume;
            if ((bVar9 & 4) != pFVar2[2].SLOT[3].ssgn) {
              iVar11 = 0x200 - iVar11;
              pFVar2[2].SLOT[3].volume = iVar11;
            }
            if (0x1ff < iVar11) {
              pFVar2[2].SLOT[3].volume = 0x3ff;
              pFVar2[2].SLOT[3].state = '\0';
              iVar11 = 0x3ff;
            }
            pFVar2[2].SLOT[3].vol_out = iVar11 + pFVar2[2].SLOT[3].tl;
          }
        }
        (OPN->SL3).key_csm = '\0';
      }
    }
    if ((v & 0x20U) != 0) {
      bVar9 = (OPN->ST).status & 0xfd;
      (OPN->ST).status = bVar9;
      if (((OPN->ST).irq != '\0') && (((OPN->ST).irqmask & bVar9) == 0)) {
        (OPN->ST).irq = '\0';
        p_Var4 = (OPN->ST).IRQ_Handler;
        if (p_Var4 != (FM_IRQHANDLER)0x0) {
          (*p_Var4)(pvVar3,0);
        }
      }
    }
    if ((v & 0x10U) != 0) {
      bVar9 = (OPN->ST).status & 0xfe;
      (OPN->ST).status = bVar9;
      if (((OPN->ST).irq != '\0') && (((OPN->ST).irqmask & bVar9) == 0)) {
        (OPN->ST).irq = '\0';
        p_Var4 = (OPN->ST).IRQ_Handler;
        if (p_Var4 != (FM_IRQHANDLER)0x0) {
          (*p_Var4)((OPN->ST).param,0);
        }
      }
    }
    if (((v & 2U) != 0) && (((OPN->ST).mode & 2) == 0)) {
      iVar11 = (uint)(OPN->ST).TB * -0x10 + 0x1000;
      (OPN->ST).TBC = iVar11;
      p_Var5 = (OPN->ST).timer_handler;
      if (p_Var5 != (FM_TIMERHANDLER)0x0) {
        (*p_Var5)(pvVar3,1,iVar11 * (OPN->ST).timer_prescaler,(OPN->ST).clock);
      }
    }
    if (((v & 1U) != 0) && (((OPN->ST).mode & 1) == 0)) {
      iVar11 = 0x400 - (OPN->ST).TA;
      (OPN->ST).TAC = iVar11;
      p_Var5 = (OPN->ST).timer_handler;
      if (p_Var5 != (FM_TIMERHANDLER)0x0) {
        (*p_Var5)(pvVar3,0,iVar11 * (OPN->ST).timer_prescaler,(OPN->ST).clock);
        iVar11 = (OPN->ST).TAC;
      }
      (OPN->ST).TAC = iVar11 << 0xc;
    }
    (OPN->ST).mode = v;
    break;
  case 0x28:
    if ((v & 3U) == 3) {
      return;
    }
    bVar6 = bVar9 & 3;
    if (((v & 4U) != 0) && ((OPN->type & 4) != 0)) {
      bVar6 = (char)(v & 3U) + 3;
    }
    pFVar2 = OPN->P_CH;
    UVar1 = pFVar2[bVar6].SLOT[0].key;
    if ((v & 0x10U) == 0) {
      if (((UVar1 != '\0') && ((OPN->SL3).key_csm == '\0' || bVar6 == 3)) &&
         (1 < pFVar2[bVar6].SLOT[0].state)) {
        pFVar2[bVar6].SLOT[0].state = '\x01';
        bVar12 = pFVar2[bVar6].SLOT[0].ssg;
        if ((bVar12 & 8) != 0) {
          uVar10 = pFVar2[bVar6].SLOT[0].volume;
          if ((bVar12 & 4) != pFVar2[bVar6].SLOT[0].ssgn) {
            uVar10 = 0x200 - uVar10;
            pFVar2[bVar6].SLOT[0].volume = uVar10;
          }
          if (0x1ff < (int)uVar10) {
            pFVar2[bVar6].SLOT[0].volume = 0x3ff;
            pFVar2[bVar6].SLOT[0].state = '\0';
            uVar10 = 0x3ff;
          }
          UVar8 = '\0';
          goto LAB_0016ed27;
        }
      }
      UVar8 = '\0';
    }
    else {
      UVar8 = '\x01';
      if ((UVar1 == '\0') && ((OPN->SL3).key_csm == '\0' || bVar6 == 3)) {
        pFVar2[bVar6].SLOT[0].phase = 0;
        pFVar2[bVar6].SLOT[0].ssgn = '\0';
        if ((uint)pFVar2[bVar6].SLOT[0].ksr + pFVar2[bVar6].SLOT[0].ar < 0x5e) {
          uVar7 = pFVar2[bVar6].SLOT[0].volume;
          bVar12 = 4;
          if ((int)uVar7 < 1) goto LAB_0016ecc4;
        }
        else {
          pFVar2[bVar6].SLOT[0].volume = 0;
          uVar7 = 0;
LAB_0016ecc4:
          bVar12 = pFVar2[bVar6].SLOT[0].sl == 0 ^ 3;
        }
        pFVar2[bVar6].SLOT[0].state = bVar12;
        uVar10 = 0x200 - uVar7 & 0x3ff;
        if ((~pFVar2[bVar6].SLOT[0].ssg & 0xc) != 0) {
          uVar10 = uVar7;
        }
        UVar8 = '\x01';
LAB_0016ed27:
        pFVar2[bVar6].SLOT[0].vol_out = uVar10 + pFVar2[bVar6].SLOT[0].tl;
      }
    }
    pFVar2[bVar6].SLOT[0].key = UVar8;
    UVar1 = pFVar2[bVar6].SLOT[2].key;
    if ((v & 0x20U) == 0) {
      if (((UVar1 != '\0') && ((OPN->SL3).key_csm == '\0' || bVar6 == 3)) &&
         (1 < pFVar2[bVar6].SLOT[2].state)) {
        pFVar2[bVar6].SLOT[2].state = '\x01';
        bVar12 = pFVar2[bVar6].SLOT[2].ssg;
        if ((bVar12 & 8) != 0) {
          uVar10 = pFVar2[bVar6].SLOT[2].volume;
          if ((bVar12 & 4) != pFVar2[bVar6].SLOT[2].ssgn) {
            uVar10 = 0x200 - uVar10;
            pFVar2[bVar6].SLOT[2].volume = uVar10;
          }
          if (0x1ff < (int)uVar10) {
            pFVar2[bVar6].SLOT[2].volume = 0x3ff;
            pFVar2[bVar6].SLOT[2].state = '\0';
            uVar10 = 0x3ff;
          }
          UVar8 = '\0';
          goto LAB_0016ee5e;
        }
      }
      UVar8 = '\0';
    }
    else {
      UVar8 = '\x01';
      if ((UVar1 == '\0') && ((OPN->SL3).key_csm == '\0' || bVar6 == 3)) {
        pFVar2[bVar6].SLOT[2].phase = 0;
        pFVar2[bVar6].SLOT[2].ssgn = '\0';
        if ((uint)pFVar2[bVar6].SLOT[2].ksr + pFVar2[bVar6].SLOT[2].ar < 0x5e) {
          uVar7 = pFVar2[bVar6].SLOT[2].volume;
          bVar12 = 4;
          if ((int)uVar7 < 1) goto LAB_0016ede3;
        }
        else {
          pFVar2[bVar6].SLOT[2].volume = 0;
          uVar7 = 0;
LAB_0016ede3:
          bVar12 = pFVar2[bVar6].SLOT[2].sl == 0 ^ 3;
        }
        pFVar2[bVar6].SLOT[2].state = bVar12;
        uVar10 = 0x200 - uVar7 & 0x3ff;
        if ((~pFVar2[bVar6].SLOT[2].ssg & 0xc) != 0) {
          uVar10 = uVar7;
        }
        UVar8 = '\x01';
LAB_0016ee5e:
        pFVar2[bVar6].SLOT[2].vol_out = uVar10 + pFVar2[bVar6].SLOT[2].tl;
      }
    }
    pFVar2[bVar6].SLOT[2].key = UVar8;
    UVar1 = pFVar2[bVar6].SLOT[1].key;
    if ((v & 0x40U) == 0) {
      if (((UVar1 != '\0') && ((OPN->SL3).key_csm == '\0' || bVar6 == 3)) &&
         (1 < pFVar2[bVar6].SLOT[1].state)) {
        pFVar2[bVar6].SLOT[1].state = '\x01';
        bVar12 = pFVar2[bVar6].SLOT[1].ssg;
        if ((bVar12 & 8) != 0) {
          uVar10 = pFVar2[bVar6].SLOT[1].volume;
          if ((bVar12 & 4) != pFVar2[bVar6].SLOT[1].ssgn) {
            uVar10 = 0x200 - uVar10;
            pFVar2[bVar6].SLOT[1].volume = uVar10;
          }
          if (0x1ff < (int)uVar10) {
            pFVar2[bVar6].SLOT[1].volume = 0x3ff;
            pFVar2[bVar6].SLOT[1].state = '\0';
            uVar10 = 0x3ff;
          }
          UVar8 = '\0';
          goto LAB_0016ef89;
        }
      }
      UVar8 = '\0';
    }
    else {
      UVar8 = '\x01';
      if ((UVar1 == '\0') && ((OPN->SL3).key_csm == '\0' || bVar6 == 3)) {
        pFVar2[bVar6].SLOT[1].phase = 0;
        pFVar2[bVar6].SLOT[1].ssgn = '\0';
        if ((uint)pFVar2[bVar6].SLOT[1].ksr + pFVar2[bVar6].SLOT[1].ar < 0x5e) {
          uVar7 = pFVar2[bVar6].SLOT[1].volume;
          bVar12 = 4;
          if ((int)uVar7 < 1) goto LAB_0016ef14;
        }
        else {
          pFVar2[bVar6].SLOT[1].volume = 0;
          uVar7 = 0;
LAB_0016ef14:
          bVar12 = pFVar2[bVar6].SLOT[1].sl == 0 ^ 3;
        }
        pFVar2[bVar6].SLOT[1].state = bVar12;
        uVar10 = 0x200 - uVar7 & 0x3ff;
        if ((~pFVar2[bVar6].SLOT[1].ssg & 0xc) != 0) {
          uVar10 = uVar7;
        }
        UVar8 = '\x01';
LAB_0016ef89:
        pFVar2[bVar6].SLOT[1].vol_out = uVar10 + pFVar2[bVar6].SLOT[1].tl;
      }
    }
    pFVar2[bVar6].SLOT[1].key = UVar8;
    UVar1 = pFVar2[bVar6].SLOT[3].key;
    if (-1 < (char)bVar9) {
      if (((UVar1 != '\0') && ((OPN->SL3).key_csm == '\0' || bVar6 == 3)) &&
         (1 < pFVar2[bVar6].SLOT[3].state)) {
        pFVar2[bVar6].SLOT[3].state = '\x01';
        bVar9 = pFVar2[bVar6].SLOT[3].ssg;
        if ((bVar9 & 8) != 0) {
          iVar11 = pFVar2[bVar6].SLOT[3].volume;
          if ((bVar9 & 4) != pFVar2[bVar6].SLOT[3].ssgn) {
            iVar11 = 0x200 - iVar11;
            pFVar2[bVar6].SLOT[3].volume = iVar11;
          }
          if (0x1ff < iVar11) {
            pFVar2[bVar6].SLOT[3].volume = 0x3ff;
            pFVar2[bVar6].SLOT[3].state = '\0';
            iVar11 = 0x3ff;
          }
          pFVar2[bVar6].SLOT[3].vol_out = iVar11 + pFVar2[bVar6].SLOT[3].tl;
        }
      }
      pFVar2[bVar6].SLOT[3].key = '\0';
      return;
    }
    if ((UVar1 == '\0') && ((OPN->SL3).key_csm == '\0' || bVar6 == 3)) {
      pFVar2[bVar6].SLOT[3].phase = 0;
      pFVar2[bVar6].SLOT[3].ssgn = '\0';
      if ((uint)pFVar2[bVar6].SLOT[3].ksr + pFVar2[bVar6].SLOT[3].ar < 0x5e) {
        uVar7 = pFVar2[bVar6].SLOT[3].volume;
        bVar9 = 4;
        if ((int)uVar7 < 1) goto LAB_0016f090;
      }
      else {
        pFVar2[bVar6].SLOT[3].volume = 0;
        uVar7 = 0;
LAB_0016f090:
        bVar9 = pFVar2[bVar6].SLOT[3].sl == 0 ^ 3;
      }
      pFVar2[bVar6].SLOT[3].state = bVar9;
      uVar10 = 0x200 - uVar7 & 0x3ff;
      if ((~pFVar2[bVar6].SLOT[3].ssg & 0xc) != 0) {
        uVar10 = uVar7;
      }
      pFVar2[bVar6].SLOT[3].vol_out = uVar10 + pFVar2[bVar6].SLOT[3].tl;
    }
    pFVar2[bVar6].SLOT[3].key = '\x01';
  }
  return;
}

Assistant:

static void OPNWriteMode(FM_OPN *OPN, int r, int v)
{
	UINT8 c;
	FM_CH *CH;

	switch(r)
	{
	case 0x21:	/* Test */
		break;
	case 0x22:	/* LFO FREQ (YM2608/YM2610/YM2610B/YM2612) */
		if (v&8) /* LFO enabled ? */
		{
			#if 0
			if (!OPN->lfo_timer_overflow)
			{
				/* restart LFO */
				OPN->lfo_cnt   = 0;
				OPN->lfo_timer = 0;
				OPN->LFO_AM    = 0;
				OPN->LFO_PM    = 0;
			}
			#endif

			OPN->lfo_timer_overflow = lfo_samples_per_step[v&7] << LFO_SH;
		}
		else
		{
			/* Valley Bell: Ported from Genesis Plus GX 1.71
				hold LFO waveform in reset state */
			OPN->lfo_timer_overflow = 0;
			OPN->lfo_timer = 0;
			OPN->lfo_cnt = 0;


			OPN->LFO_PM = 0;
			OPN->LFO_AM = 126;
			/* OPN->lfo_timer_overflow = 0; */
		}
		break;
	case 0x24:	/* timer A High 8*/
		OPN->ST.TA = (OPN->ST.TA & 0x03)|(((int)v)<<2);
		break;
	case 0x25:	/* timer A Low 2*/
		OPN->ST.TA = (OPN->ST.TA & 0x3fc)|(v&3);
		break;
	case 0x26:	/* timer B */
		OPN->ST.TB = (UINT8)v;
		break;
	case 0x27:	/* mode, timer control */
		set_timers( OPN, &(OPN->ST),OPN->ST.param,v );
		break;
	case 0x28:	/* key on / off */
		c = v & 0x03;
		if( c == 3 ) break;
		if( (v&0x04) && (OPN->type & TYPE_6CH) ) c+=3;
		CH = OPN->P_CH;
		CH = &CH[c];
		if(v&0x10) FM_KEYON(OPN,CH,SLOT1); else FM_KEYOFF(OPN,CH,SLOT1);
		if(v&0x20) FM_KEYON(OPN,CH,SLOT2); else FM_KEYOFF(OPN,CH,SLOT2);
		if(v&0x40) FM_KEYON(OPN,CH,SLOT3); else FM_KEYOFF(OPN,CH,SLOT3);
		if(v&0x80) FM_KEYON(OPN,CH,SLOT4); else FM_KEYOFF(OPN,CH,SLOT4);
		break;
	}
}